

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O2

void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *p,Vec_Int_t *vMap)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Bac_NameType_t BVar7;
  char *pPref;
  int iVar8;
  int iVar9;
  
  if ((p->vName).pArray == (int *)0x0) {
    Bac_NtkStartNames(p);
  }
  uVar1 = Bac_ManAssignCountNames(p);
  iVar2 = Abc_Base10Log(uVar1);
  for (iVar9 = 0; uVar1 = (p->vType).nSize, iVar9 < (int)uVar1; iVar9 = iVar9 + 1) {
    iVar3 = Bac_ObjIsCi(p,iVar9);
    if ((iVar3 != 0) && (iVar3 = Bac_ObjNameInt(p,iVar9), iVar3 != 0)) {
      iVar3 = Bac_ObjNameId(p,iVar9);
      Vec_IntWriteEntry(vMap,iVar3,1);
    }
  }
  iVar9 = 1;
  for (iVar3 = 0; iVar3 < (int)uVar1; iVar3 = iVar3 + 1) {
    iVar4 = Bac_ObjIsBox(p,iVar3);
    if ((iVar4 != 0) && (iVar4 = Bac_ObjNameInt(p,iVar3), iVar4 != 0)) {
      iVar4 = Bac_ObjNameId(p,iVar3);
      Vec_IntWriteEntry(vMap,iVar4,1);
    }
    uVar1 = (p->vType).nSize;
  }
  iVar8 = 0;
  iVar4 = -1;
  iVar3 = 1;
  do {
    if ((int)uVar1 <= iVar8) {
      iVar2 = (p->vInfo).nSize;
      if (4 < iVar2 + 2U) {
        iVar9 = 0;
        iVar3 = 0;
        for (iVar4 = 0; iVar4 < iVar2 / 3; iVar4 = iVar4 + 1) {
          iVar2 = Bac_NtkInfoType(p,iVar4);
          if (iVar2 == 1) {
            iVar2 = Vec_IntEntry(&p->vInputs,iVar9);
            iVar8 = Bac_ObjBit(p,iVar2);
            if (iVar8 != 0) {
              __assert_fail("!Bac_ObjBit(p, iObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                            ,0x160,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)")
              ;
            }
            BVar7 = Bac_ObjNameType(p,iVar2);
            if (BAC_NAME_WORD < BVar7) {
              __assert_fail("Bac_ObjNameType(p, iObj) <= BAC_NAME_WORD",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                            ,0x161,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)")
              ;
            }
            iVar2 = Bac_ObjNameId(p,iVar2);
            Bac_NtkSetInfoName(p,iVar4,iVar2 * 4 + 1);
            iVar2 = Bac_NtkInfoRange(p,iVar4);
            iVar9 = iVar9 + iVar2;
          }
          else {
            iVar2 = Bac_NtkInfoType(p,iVar4);
            if (iVar2 != 2) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                            ,0x16e,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)")
              ;
            }
            iVar2 = Vec_IntEntry(&p->vOutputs,iVar3);
            iVar8 = Bac_ObjBit(p,iVar2);
            if (iVar8 != 0) {
              __assert_fail("!Bac_ObjBit(p, iObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                            ,0x168,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)")
              ;
            }
            iVar2 = Bac_ObjFanin(p,iVar2);
            BVar7 = Bac_ObjNameType(p,iVar2);
            if (BAC_NAME_WORD < BVar7) {
              __assert_fail("Bac_ObjNameType(p, iObj) <= BAC_NAME_WORD",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                            ,0x16a,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)")
              ;
            }
            iVar2 = Bac_ObjNameId(p,iVar2);
            Bac_NtkSetInfoName(p,iVar4,iVar2 * 4 + 2);
            iVar2 = Bac_NtkInfoRange(p,iVar4);
            iVar3 = iVar3 + iVar2;
          }
          iVar2 = (p->vInfo).nSize;
        }
        if (iVar9 != (p->vInputs).nSize) {
          __assert_fail("nPis == Bac_NtkPiNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                        ,0x170,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
        }
        if (iVar3 != (p->vOutputs).nSize) {
          __assert_fail("nPos == Bac_NtkPoNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                        ,0x171,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
        }
        uVar1 = (p->vType).nSize;
      }
      iVar2 = Abc_Base10Log(uVar1);
      for (iVar9 = 0; iVar9 < (int)uVar1; iVar9 = iVar9 + 1) {
        iVar3 = Bac_ObjIsBox(p,iVar9);
        if ((iVar3 != 0) && (iVar3 = Bac_ObjNameInt(p,iVar9), iVar3 == 0)) {
          iVar3 = Bac_ManAssignInternTwo(p,iVar9,iVar2,"g",vMap);
          Bac_ObjSetName(p,iVar9,iVar3 * 4);
        }
        uVar1 = (p->vType).nSize;
      }
      for (iVar2 = 0; iVar2 < (p->vInputs).nSize; iVar2 = iVar2 + 1) {
        iVar9 = Vec_IntEntry(&p->vInputs,iVar2);
        BVar7 = Bac_ObjNameType(p,iVar9);
        if (BVar7 < BAC_NAME_INFO) {
          iVar9 = Bac_ObjNameId(p,iVar9);
          Vec_IntWriteEntry(vMap,iVar9,0);
        }
      }
      iVar2 = 0;
      while( true ) {
        if ((p->vType).nSize <= iVar2) {
          return;
        }
        iVar9 = Bac_ObjIsBox(p,iVar2);
        if (iVar9 != 0) break;
LAB_0031b9f2:
        iVar2 = iVar2 + 1;
      }
      iVar3 = Bac_ObjNameId(p,iVar2);
      iVar9 = iVar2;
      do {
        Vec_IntWriteEntry(vMap,iVar3,0);
        do {
          iVar9 = iVar9 + 1;
          if (((p->vType).nSize <= iVar9) || (iVar3 = Bac_ObjIsBo(p,iVar9), iVar3 == 0))
          goto LAB_0031b9f2;
          BVar7 = Bac_ObjNameType(p,iVar9);
        } while (BAC_NAME_WORD < BVar7);
        iVar3 = Bac_ObjNameId(p,iVar9);
      } while( true );
    }
    iVar5 = Bac_ObjIsCi(p,iVar8);
    if (iVar5 != 0) {
      iVar5 = Bac_ObjNameInt(p,iVar8);
      if (iVar5 == 0) {
        iVar5 = Bac_ObjBit(p,iVar8);
        if (iVar5 == 0) {
          iVar4 = Bac_ObjIsPi(p,iVar8);
          if (iVar4 == 0) {
            iVar4 = Bac_ObjIsBo(p,iVar8);
            if ((iVar4 == 0) || (iVar5 = Bac_ObjBit(p,iVar8), iVar4 = iVar9, iVar5 != 0)) {
              __assert_fail("Bac_ObjIsBo(p, i) && !Bac_ObjBit(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                            ,0x13a,"int Bac_BoxBoRange(Bac_Ntk_t *, int)");
            }
            do {
              iVar5 = iVar4;
              if (((p->vType).nSize <= iVar5) || (iVar4 = Bac_ObjIsBo(p,iVar5), iVar4 == 0)) break;
              iVar6 = Bac_ObjBit(p,iVar5);
              iVar4 = iVar5 + 1;
            } while (iVar6 != 0);
          }
          else {
            iVar4 = Bac_ObjIsPi(p,iVar8);
            if ((iVar4 == 0) || (iVar5 = Bac_ObjBit(p,iVar8), iVar4 = iVar9, iVar5 != 0)) {
              __assert_fail("Bac_ObjIsPi(p, i) && !Bac_ObjBit(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                            ,0x13b,"int Bac_ObjPiRange(Bac_Ntk_t *, int)");
            }
            do {
              iVar5 = iVar4;
              if (((p->vType).nSize <= iVar5) || (iVar4 = Bac_ObjIsPi(p,iVar5), iVar4 == 0)) break;
              iVar6 = Bac_ObjBit(p,iVar5);
              iVar4 = iVar5 + 1;
            } while (iVar6 != 0);
          }
          iVar4 = Bac_ObjIsPi(p,iVar8);
          pPref = "i";
          if (iVar4 == 0) {
            pPref = "n";
          }
          iVar4 = Bac_ManAssignInternTwo(p,iVar3,iVar2,pPref,vMap);
          uVar1 = iVar4 << 2;
          if (iVar5 - iVar8 != 1) {
            uVar1 = uVar1 | 1;
          }
          Bac_ObjSetName(p,iVar8,uVar1);
          iVar4 = 1;
          iVar3 = iVar3 + 1;
        }
        else {
          if (iVar4 < 1) {
            __assert_fail("iBit > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                          ,0x148,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
          }
          Bac_ObjSetName(p,iVar8,iVar4 * 4 + 3);
          iVar4 = iVar4 + 1;
        }
      }
      else {
        iVar4 = -1;
      }
    }
    iVar8 = iVar8 + 1;
    uVar1 = (p->vType).nSize;
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

void Bac_ManAssignInternWordNamesNtk( Bac_Ntk_t * p, Vec_Int_t * vMap )
{
    int k, iObj, iTerm, iName = -1, iBit = -1;
    int nDigits, nPis = 0, nPos = 0, nNames = 1;
    // start names
    if ( !Bac_NtkHasNames(p) )
        Bac_NtkStartNames(p);
    nDigits = Abc_Base10Log( Bac_ManAssignCountNames(p) );
    // populate map with the currently used names
    Bac_NtkForEachCi( p, iObj )
        if ( Bac_ObjNameInt(p, iObj) )
            Vec_IntWriteEntry( vMap, Bac_ObjNameId(p, iObj), 1 );
    Bac_NtkForEachBox( p, iObj )
        if ( Bac_ObjNameInt(p, iObj) )
            Vec_IntWriteEntry( vMap, Bac_ObjNameId(p, iObj), 1 );
    // assign CI names
    Bac_NtkForEachCi( p, iObj )
    {
        if ( Bac_ObjNameInt(p, iObj) )
        {
            iName = -1;
            iBit = -1;
            continue;
        }
        if ( Bac_ObjBit(p, iObj) )
        {
            assert( iBit > 0 );
            Bac_ObjSetName( p, iObj, Abc_Var2Lit2(iBit++, BAC_NAME_INDEX) );
        }
        else
        {
            //int Type = Bac_ObjType(p, iObj);
            int Range = Bac_ObjIsPi(p, iObj) ? Bac_ObjPiRange(p, iObj) : Bac_BoxBoRange(p, iObj);
            iName = Bac_ManAssignInternTwo( p, nNames++, nDigits, (char*)(Bac_ObjIsPi(p, iObj) ? "i":"n"), vMap );
            if ( Range == 1 )
                Bac_ObjSetName( p, iObj, Abc_Var2Lit2(iName, BAC_NAME_BIN) );
            else
                Bac_ObjSetName( p, iObj, Abc_Var2Lit2(iName, BAC_NAME_WORD) );
            iBit = 1;
        }
    }
    // transfer names to the interface
    if ( Bac_NtkInfoNum(p) )
    {
        for ( k = 0; k < Bac_NtkInfoNum(p); k++ )
        {
            //char * pName = Bac_NtkName(p);
            if ( Bac_NtkInfoType(p, k) == 1 ) // PI
            {
                iObj = Bac_NtkPi(p, nPis);
                assert( !Bac_ObjBit(p, iObj) );
                assert( Bac_ObjNameType(p, iObj) <= BAC_NAME_WORD );
                Bac_NtkSetInfoName( p, k, Abc_Var2Lit2(Bac_ObjNameId(p, iObj), 1) );
                nPis += Bac_NtkInfoRange(p, k);
            }
            else if ( Bac_NtkInfoType(p, k) == 2 ) // PO
            {
                iObj = Bac_NtkPo(p, nPos);
                assert( !Bac_ObjBit(p, iObj) );
                iObj = Bac_ObjFanin(p, iObj);
                assert( Bac_ObjNameType(p, iObj) <= BAC_NAME_WORD );
                Bac_NtkSetInfoName( p, k, Abc_Var2Lit2(Bac_ObjNameId(p, iObj), 2) );
                nPos += Bac_NtkInfoRange(p, k);
            }
            else assert( 0 );
        }
        assert( nPis == Bac_NtkPiNum(p) );
        assert( nPos == Bac_NtkPoNum(p) );
    }
    // assign instance names
    nDigits = Abc_Base10Log( Bac_NtkObjNum(p) );
    Bac_NtkForEachBox( p, iObj )
        if ( !Bac_ObjNameInt(p, iObj) )
        {
            iName = Bac_ManAssignInternTwo( p, iObj, nDigits, "g", vMap );
            Bac_ObjSetName( p, iObj, Abc_Var2Lit2(iName, BAC_NAME_BIN) );
        }
    // unmark all names
    Bac_NtkForEachPi( p, iObj, k )
        if ( Bac_ObjNameType(p, iObj) <= BAC_NAME_WORD )
            Vec_IntWriteEntry( vMap, Bac_ObjNameId(p, iObj), 0 );
    Bac_NtkForEachBox( p, iObj )
    {
        Vec_IntWriteEntry( vMap, Bac_ObjNameId(p, iObj), 0 );
        Bac_BoxForEachBo( p, iObj, iTerm, k )
            if ( Bac_ObjNameType(p, iTerm) <= BAC_NAME_WORD )
                Vec_IntWriteEntry( vMap, Bac_ObjNameId(p, iTerm), 0 );
    }
//    printf( "Generated %d word-level names.\n", nNames-1 );
}